

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O0

void __thiscall TEST_GROUP_CppUTestGroupPluginTest::setup(TEST_GROUP_CppUTestGroupPluginTest *this)

{
  DummyPlugin *pDVar1;
  DummyPluginWhichAcceptsParameters *this_00;
  TestTestingFixture *this_01;
  TestRegistry *pTVar2;
  SimpleString local_58;
  undefined1 local_41;
  SimpleString local_40;
  undefined1 local_2d;
  SimpleString local_20;
  TEST_GROUP_CppUTestGroupPluginTest *local_10;
  TEST_GROUP_CppUTestGroupPluginTest *this_local;
  
  local_10 = this;
  pDVar1 = (DummyPlugin *)
           operator_new(0x38,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                        ,0x5d);
  local_2d = 1;
  SimpleString::SimpleString(&local_20,"GenericPlugin");
  DummyPlugin::DummyPlugin(pDVar1,&local_20);
  local_2d = 0;
  this->firstPlugin = pDVar1;
  SimpleString::~SimpleString(&local_20);
  this_00 = (DummyPluginWhichAcceptsParameters *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                         ,0x5e);
  local_41 = 1;
  SimpleString::SimpleString(&local_40,"GenericPlugin2");
  DummyPluginWhichAcceptsParameters::DummyPluginWhichAcceptsParameters(this_00,&local_40);
  local_41 = 0;
  this->secondPlugin = this_00;
  SimpleString::~SimpleString(&local_40);
  pDVar1 = (DummyPlugin *)
           operator_new(0x38,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                        ,0x5f);
  SimpleString::SimpleString(&local_58,"GenericPlugin3");
  DummyPlugin::DummyPlugin(pDVar1,&local_58);
  this->thirdPlugin = pDVar1;
  SimpleString::~SimpleString(&local_58);
  this_01 = (TestTestingFixture *)
            operator_new(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                         ,0x60);
  TestTestingFixture::TestTestingFixture(this_01);
  this->genFixture = this_01;
  pTVar2 = TestTestingFixture::getRegistry(this->genFixture);
  this->registry = pTVar2;
  (*this->registry->_vptr_TestRegistry[0xd])(this->registry,this->firstPlugin);
  sequenceNumber = 1;
  return;
}

Assistant:

void setup() _override
    {
        firstPlugin = new DummyPlugin(GENERIC_PLUGIN);
        secondPlugin = new DummyPluginWhichAcceptsParameters(GENERIC_PLUGIN2);
        thirdPlugin = new DummyPlugin(GENERIC_PLUGIN3);
        genFixture = new TestTestingFixture;
        registry = genFixture->getRegistry();
        registry->installPlugin(firstPlugin);
        sequenceNumber = 1;
    }